

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcheckmesh.cpp
# Opt level: O1

int __thiscall TPZCheckMesh::VerifyAllConnects(TPZCheckMesh *this)

{
  int iVar1;
  ostream *this_00;
  int iVar2;
  long *plVar3;
  int connect;
  int iVar4;
  
  iVar1 = (int)(this->fMesh->fConnectVec).super_TPZChunkVector<TPZConnect,_10>.fNElements;
  if (iVar1 < 1) {
    iVar4 = 1;
  }
  else {
    connect = 0;
    iVar4 = 1;
    do {
      iVar2 = VerifyConnect(this,connect);
      if ((iVar2 == 0) ||
         (iVar2 = VerifyCompatibilityBetweenNShapesAndBlockSize(this,connect), iVar2 == 0)) {
        this_00 = this->fOut;
        std::__ostream_insert<char,std::char_traits<char>>
                  (this_00,"Check failed for connect: ",0x1a);
        plVar3 = (long *)std::ostream::operator<<(this_00,connect);
        std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
        std::ostream::put((char)plVar3);
        std::ostream::flush();
        iVar4 = 0;
      }
      connect = connect + 1;
    } while (iVar1 != connect);
  }
  return iVar4;
}

Assistant:

int TPZCheckMesh::VerifyAllConnects() {
	int ncon = fMesh->NConnects();
	int i;
	int check = 1;
	for (i=0; i<ncon; i++){
		//(*fOut) << "Startint to check consistency for connect " << i << endl;
		if (!VerifyConnect(i) || !VerifyCompatibilityBetweenNShapesAndBlockSize(i)) {
			check = 0;
			(*fOut) << "Check failed for connect: " << i << endl;
		}
	}
	return check;
}